

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O0

void SayHelloWorld(void)

{
  pthread_t pVar1;
  ostream *poVar2;
  LockGuard local_10;
  LockGuard lock;
  
  usleep(1000);
  LockGuard::LockGuard(&local_10,&mutex);
  pVar1 = pthread_self();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)pVar1);
  poVar2 = std::operator<<(poVar2,", Hello World");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  globalCnt = globalCnt + 1;
  LockGuard::~LockGuard(&local_10);
  return;
}

Assistant:

void SayHelloWorld()
{
	usleep(1000);
	LockGuard lock(mutex);
	cout << (unsigned int)pthread_self() << ", Hello World" << endl;
	++globalCnt;
}